

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm.hpp
# Opt level: O2

int qpixl::writePGMA<std::vector<double,std::allocator<double>>>
              (string *fileName,vector<double,_std::allocator<double>_> *data,size_t nrows,
              size_t ncols,size_t maxval,int zeroPad)

{
  char cVar1;
  ostream *poVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  ofstream ostrm;
  
  std::ofstream::ofstream(&ostrm,(string *)fileName,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR -- failed to open ");
    poVar2 = std::operator<<(poVar2,(string *)fileName);
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar5 = -1;
  }
  else {
    poVar2 = std::operator<<((ostream *)&ostrm,"P2");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&ostrm,"# Generated by QPIXL++");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&ostrm);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&ostrm);
    std::endl<char,std::char_traits<char>>(poVar2);
    sVar3 = nrows;
    if ((zeroPad & 0xfffffffdU) != 0) {
      if (zeroPad != 1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR -- zeroPad : ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,zeroPad);
        std::endl<char,std::char_traits<char>>(poVar2);
        iVar5 = -3;
        goto LAB_00108105;
      }
      sVar3 = nextpow2(nrows);
    }
    lVar8 = 0;
    for (sVar4 = 0; sVar6 = ncols, lVar7 = lVar8, sVar4 != nrows; sVar4 = sVar4 + 1) {
      while (sVar6 != 0) {
        dVar9 = ceil(*(double *)
                      ((long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar7));
        iVar5 = (int)dVar9;
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        if ((int)maxval <= iVar5) {
          iVar5 = (int)maxval;
        }
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&ostrm,iVar5);
        std::operator<<(poVar2," ");
        sVar6 = sVar6 - 1;
        lVar7 = lVar7 + sVar3 * 8;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&ostrm);
      lVar8 = lVar8 + 8;
    }
    iVar5 = 0;
    std::ofstream::close();
  }
LAB_00108105:
  std::ofstream::~ofstream(&ostrm);
  return iVar5;
}

Assistant:

int writePGMA( const std::string fileName, V& data , const size_t nrows , 
                 const size_t ncols , const size_t maxval , 
                 const int zeroPad = 0 ) {
    using T = typename V::value_type ; 
    std::ofstream ostrm( fileName , std::ios::out ) ;

    if ( !ostrm.is_open( ) ) {
      std::cerr << "ERROR -- failed to open " << fileName << std::endl ;
      return -1 ;
    } else {

      // Write header
      ostrm << "P2" << std::endl ;
      ostrm << "# Generated by QPIXL++" << std::endl ;
      ostrm << ncols << " " << nrows << std::endl ;
      ostrm << maxval << std::endl ;

      // Write data
      size_t ldm = 0 ;
      if ( zeroPad == 0 || zeroPad == 2 ) {
        ldm = nrows ;
      } else if ( zeroPad == 1 ) ldm = qpixl::nextpow2( nrows ) ;
      else {
        std::cerr << "ERROR -- zeroPad : " << zeroPad << std::endl ;
          return -3 ;
      }

      for ( int row = 0; row < nrows; ++row ) {
          for ( int col = 0; col < ncols; ++col ) {
            ostrm << std::min( std::max( 
                     int( ceil( data[row + col * ldm] ) ), 0 ), int(maxval) ) 
                  << " " ;    
          }
          ostrm << std::endl ;
      }
    }

    // Close file
    ostrm.close() ;

    return 0 ;
  }